

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace.h
# Opt level: O2

bool __thiscall snestistics::OpInfo::operator<(OpInfo *this,OpInfo *other)

{
  bool bVar1;
  
  bVar1 = this->DB < other->DB;
  if ((((this->DB == other->DB) && (bVar1 = this->DP < other->DP, this->DP == other->DP)) &&
      (bVar1 = this->indirect_base_pointer < other->indirect_base_pointer,
      this->indirect_base_pointer == other->indirect_base_pointer)) &&
     (((bVar1 = this->X < other->X, this->X == other->X &&
       (bVar1 = this->Y < other->Y, this->Y == other->Y)) &&
      (bVar1 = this->P < other->P, this->P == other->P)))) {
    bVar1 = this->jump_target < other->jump_target;
  }
  return bVar1;
}

Assistant:

inline bool operator<(const OpInfo &other) const {
		if (DB != other.DB) return DB < other.DB;
		if (DP != other.DP) return DP < other.DP;
		if (indirect_base_pointer != other.indirect_base_pointer) return indirect_base_pointer < other.indirect_base_pointer;
		if (X != other.X) return X < other.X;
		if (Y != other.Y) return Y < other.Y;
		if (P != other.P) return P < other.P;
		if (jump_target != other.jump_target) return jump_target < other.jump_target;
		return false;
	}